

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall ot::commissioner::UdpSocket::UdpSocket(UdpSocket *this,UdpSocket *aOther)

{
  (this->super_Socket).mEventBase = (aOther->super_Socket).mEventBase;
  memset(&(this->super_Socket).mEvent,0,0xa2);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__UdpSocket_00274ed8;
  *(undefined4 *)&(this->super_Socket).field_0xb4 =
       *(undefined4 *)&(aOther->super_Socket).field_0xb4;
  this->mIsBound = aOther->mIsBound;
  mbedtls_net_init((mbedtls_net_context *)&(aOther->super_Socket).field_0xb4);
  return;
}

Assistant:

UdpSocket::UdpSocket(UdpSocket &&aOther)
    : Socket(aOther.mEventBase)
    , mNetCtx(aOther.mNetCtx)
    , mIsBound(aOther.mIsBound)
{
    mbedtls_net_init(&aOther.mNetCtx);
}